

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

void __thiscall ProgramResult::getFromExecution(ProgramResult *this,string *command)

{
  int iVar1;
  char *pcVar2;
  FILE *pFVar3;
  double dVar4;
  string local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  FILE *local_530;
  FILE *stream;
  char buffer [1024];
  undefined1 local_120 [4];
  int MAX_BUFFER;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  Timer timer;
  string *command_local;
  ProgramResult *this_local;
  
  timer.total = (double)command;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
  wasm::Timer::Timer((Timer *)local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  wasm::Timer::start((Timer *)local_48);
  std::__cxx11::to_string((string *)local_120,timeout);
  std::operator+(&local_100,"timeout ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
  std::operator+(&local_e0,&local_100,"s ");
  std::operator+(&local_c0,&local_e0,command);
  std::operator+(&local_a0,&local_c0," > /dev/null 2> /dev/null");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = system(pcVar2);
  this->code = iVar1;
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)local_120);
  buffer[0x3fc] = '\0';
  buffer[0x3fd] = '\x04';
  buffer[0x3fe] = '\0';
  buffer[0x3ff] = '\0';
  std::__cxx11::to_string(&local_5d0,timeout);
  std::operator+(&local_5b0,"timeout ",&local_5d0);
  std::operator+(&local_590,&local_5b0,"s ");
  std::operator+(&local_570,&local_590,command);
  std::operator+(&local_550,&local_570," 2> /dev/null");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pFVar3 = popen(pcVar2,"r");
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_5d0);
  local_530 = pFVar3;
  while( true ) {
    pcVar2 = fgets((char *)&stream,0x400,local_530);
    if (pcVar2 == (char *)0x0) break;
    std::__cxx11::string::append((char *)&this->output);
  }
  pclose(local_530);
  wasm::Timer::stop((Timer *)local_48);
  dVar4 = wasm::Timer::getTotal((Timer *)local_48);
  this->time = dVar4 / 2.0;
  wasm::Timer::~Timer((Timer *)local_48);
  return;
}

Assistant:

void getFromExecution(std::string command) {
    Timer timer;
    timer.start();
    // do this using just core stdio.h and stdlib.h, for portability
    // sadly this requires two invokes
    code = system(("timeout " + std::to_string(timeout) + "s " + command +
                   " > /dev/null 2> /dev/null")
                    .c_str());
    const int MAX_BUFFER = 1024;
    char buffer[MAX_BUFFER];
    FILE* stream = popen(
      ("timeout " + std::to_string(timeout) + "s " + command + " 2> /dev/null")
        .c_str(),
      "r");
    while (fgets(buffer, MAX_BUFFER, stream) != NULL) {
      output.append(buffer);
    }
    pclose(stream);
    timer.stop();
    time = timer.getTotal() / 2;
  }